

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

UniformWeighting * __thiscall
CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting
          (KNearestNeighborsClassifier *this)

{
  UniformWeighting *this_00;
  
  if (this->_oneof_case_[2] == 200) {
    this_00 = (this->WeightingScheme_).uniformweighting_;
  }
  else {
    clear_WeightingScheme(this);
    this->_oneof_case_[2] = 200;
    this_00 = (UniformWeighting *)operator_new(0x18);
    UniformWeighting::UniformWeighting(this_00);
    (this->WeightingScheme_).uniformweighting_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::UniformWeighting* KNearestNeighborsClassifier::mutable_uniformweighting() {
  if (!has_uniformweighting()) {
    clear_WeightingScheme();
    set_has_uniformweighting();
    WeightingScheme_.uniformweighting_ = new ::CoreML::Specification::UniformWeighting;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.KNearestNeighborsClassifier.uniformWeighting)
  return WeightingScheme_.uniformweighting_;
}